

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

bool ICM::Parser::createAST(Match *match,AST *ast,ElementPool *EP)

{
  MatchType MVar1;
  uint uVar2;
  char *pcVar3;
  char *pcVar4;
  bool bVar5;
  Element EVar6;
  Element EVar7;
  MatchResult local_100;
  string local_e0;
  anon_union_4_2_4727c1b0_for_Element_0 local_c0 [2];
  uint_t local_b8;
  anon_union_4_2_4727c1b0_for_Element_0 local_b0 [2];
  uint_t local_a8;
  uint local_a0 [4];
  string local_90;
  byte local_6a;
  byte local_69;
  undefined1 auStack_68 [6];
  bool emptybreak;
  bool firstMatchBraket;
  undefined1 local_48 [8];
  MatchResult mr;
  ElementPool *EP_local;
  AST *ast_local;
  Match *match_local;
  
  mr._24_8_ = EP;
  Match::matchNext((MatchResult *)local_48,match);
  while( true ) {
    MVar1 = MatchResult::getType((MatchResult *)local_48);
    bVar5 = true;
    if (MVar1 != MT_Null) {
      MVar1 = MatchResult::getType((MatchResult *)local_48);
      bVar5 = MVar1 == MT_Comment;
    }
    if (!bVar5) break;
    pcVar3 = MatchResult::begin((MatchResult *)local_48);
    pcVar4 = MatchResult::end((MatchResult *)local_48);
    if (pcVar3 == pcVar4) {
      return false;
    }
    Match::matchNext((MatchResult *)auStack_68,match);
  }
  MVar1 = MatchResult::getType((MatchResult *)local_48);
  if ((MVar1 != MT_LBracket) &&
     (MVar1 = MatchResult::getType((MatchResult *)local_48), MVar1 != MT_LSBracket)) {
    uVar2 = Match::getCurLineNum(match);
    printf("Syntax Error in line(%d).\n",(ulong)uVar2);
    return false;
  }
  local_69 = 0;
  local_6a = 0;
  while( true ) {
    pcVar3 = MatchResult::begin((MatchResult *)local_48);
    pcVar4 = MatchResult::end((MatchResult *)local_48);
    if (pcVar3 == pcVar4) break;
    MatchResult::getString_abi_cxx11_(&local_90,(MatchResult *)local_48);
    std::__cxx11::string::operator[]((ulong)&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    MVar1 = MatchResult::getType((MatchResult *)local_48);
    switch(MVar1) {
    case MT_LBracket:
      AST::pushNode(ast);
      local_69 = 1;
      local_6a = 1;
      break;
    case MT_RBracket:
      if ((local_69 & 1) != 0) {
        local_a0[0] = Match::getCurLineNum(match);
        println<char[23],unsigned_int,char[3]>
                  ((char (*) [23])"Unfind Method in Line(",local_a0,(char (*) [3])").");
        return false;
      }
      AST::retNode(ast);
      break;
    case MT_LSBracket:
      AST::pushNode(ast);
      EVar6 = ASTBase::Element::Keyword(list_);
      local_a8 = EVar6.index;
      local_b0[0] = EVar6.field_0;
      AST::pushData(ast,(Element *)&local_b0[0].field_0);
      local_69 = 0;
      local_6a = 1;
      break;
    case MT_RSBracket:
      AST::retNode(ast);
      break;
    default:
      break;
    case MT_Identifier:
    case MT_Keyword:
    case MT_Boolean:
    case MT_Number:
    case MT_String:
      MVar1 = MatchResult::getType((MatchResult *)local_48);
      MatchResult::getString_abi_cxx11_(&local_e0,(MatchResult *)local_48);
      EVar7 = createElementData(MVar1,&local_e0,(ElementPool *)mr._24_8_);
      local_b8 = EVar7.index;
      local_c0[0] = EVar7.field_0;
      AST::pushData(ast,(Element *)&local_c0[0].field_0);
      std::__cxx11::string::~string((string *)&local_e0);
      local_69 = 0;
    }
    if (((local_6a & 1) != 0) && (bVar5 = AST::isend(ast), bVar5)) break;
    Match::matchNext(&local_100,match);
  }
  bVar5 = AST::empty(ast);
  if (bVar5) {
    return false;
  }
  bVar5 = AST::isend(ast);
  if (!bVar5) {
    uVar2 = Match::getCurLineNum(match);
    printf("Error match \')\' in line(%d).\n",(ulong)uVar2);
    return false;
  }
  return true;
}

Assistant:

bool createAST(Match &match, AST &ast, Compiler::ElementPool &EP)
		{
			MatchResult mr = match.matchNext();

			// Check Unmatch
			while (mr.getType() == MT_Null || mr.getType() == MT_Comment) {
				if (mr.begin() != mr.end())
					mr = match.matchNext();
				else
					return false;
			}
			if (mr.getType() != MT_LBracket && mr.getType() != MT_LSBracket) {
				printf("Syntax Error in line(%d).\n", match.getCurLineNum());
				return false;
			}

			// Start Match
			bool firstMatchBraket = false;
			bool emptybreak = false;

			while (mr.begin() != mr.end()) {

				if (mr.getString()[0] != '\n') {
					//println(mr);
				}

				switch (mr.getType()) {
				case MT_LBracket:
					ast.pushNode();
					firstMatchBraket = true;
					emptybreak = true;
					break;
				case MT_RBracket:
					if (firstMatchBraket) {
						println("Unfind Method in Line(", match.getCurLineNum(), ").");
						return false;
					}
					ast.retNode();
					break;
				case MT_LSBracket:
					ast.pushNode();
					ast.pushData(AST::Element::Keyword(Keyword::list_));
					firstMatchBraket = false;
					emptybreak = true;
					break;
				case MT_RSBracket:
					ast.retNode();
					break;
				case MT_Identifier: case MT_Keyword:
				case MT_Number: case MT_String: case MT_Boolean:
					//if (firstMatchBraket) {
					//	printf("Error '%s' is not function in line(%d).\n", mr.getString().c_str(), match.getCurLineNum());
					//	return false;
					//}
					ast.pushData(createElementData(mr.getType(), mr.getString(), EP));
					firstMatchBraket = false;
					break;
				default:
					break;
				}

				if (emptybreak && ast.isend()) {
					break;
				}
				mr = match.matchNext();
			}

			if (ast.empty())
				return false;

			if (!ast.isend()) {
				printf("Error match ')' in line(%d).\n", match.getCurLineNum());
				return false;
			}
			return true;
		}